

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  pointer prVar2;
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 *local_30;
  code *local_28;
  undefined8 *local_20;
  code *local_18;
  
  local_38 = **(undefined8 **)(**(long **)this + 8);
  local_40 = (*(undefined8 **)(**(long **)this + 8))[1];
  prVar2 = lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
           ::iterator::operator->(*(iterator **)(this + 8));
  puVar1 = (undefined8 *)(prVar2->second->super_Message).super_MessageLite._internal_metadata_.ptr_;
  local_48 = *puVar1;
  local_50 = puVar1[1];
  local_20 = &local_50;
  local_28 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_18 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format.size_ = (size_t)&local_30;
  format.data_ = (void *)0xbb;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x2;
  local_30 = &local_40;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)
             "Enum name %s has the same name as %s if you ignore case and strip out the enum name prefix (if any). (If you are using allow_alias, please assign the same number to each enum value name.)"
             ,format,args);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}